

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

void CivetServer::urlDecode(char *src,size_t src_len,string *dst,bool is_form_url_encoded)

{
  pointer pcVar1;
  uint uVar2;
  out_of_range *this;
  undefined7 in_register_00000009;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  std::vector<char,_std::allocator<char>_>::vector(&local_40,src_len + 1,&local_41);
  uVar2 = mg_url_decode(src,(int)src_len,
                        local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (int)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                        (int)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                        (int)CONCAT71(in_register_00000009,is_form_url_encoded));
  if (-1 < (int)uVar2) {
    pcVar1 = (dst->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)dst,pcVar1,pcVar1 + dst->_M_string_length,
               local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar2);
    if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void
CivetServer::urlDecode(const char *src,
                       size_t src_len,
                       std::string &dst,
                       bool is_form_url_encoded)
{
	// assign enough buffer
	std::vector<char> buf(src_len + 1);
	int r = mg_url_decode(src,
	                      static_cast<int>(src_len),
	                      &buf[0],
	                      static_cast<int>(buf.size()),
	                      is_form_url_encoded);
	if (r < 0) {
		// never reach here
		throw std::out_of_range("");
	}
	// dst can contain NUL characters
	dst.assign(buf.begin(), buf.begin() + r);
}